

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall bloaty::ArgParser::TryParseOption(ArgParser *this,string_view flag,string_view *val)

{
  string_view expected;
  string_view format;
  string_view value;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_t *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  ArgParser *in_RDI;
  string_view sVar4;
  string_view arg;
  bool is_long;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  int line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  byte bVar5;
  Nonnull<absl::string_view_*> in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec4;
  byte bVar6;
  undefined1 in_stack_fffffffffffffec5;
  byte bVar7;
  undefined1 in_stack_fffffffffffffec6;
  byte bVar8;
  _Alloc_hider in_stack_fffffffffffffec7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string local_118 [32];
  undefined1 local_f8 [16];
  size_t local_e8;
  char *local_e0;
  size_t local_c8;
  char *pcStack_c0;
  Arg local_b0 [2];
  size_t local_50;
  char *local_48;
  string_view local_40;
  byte local_29;
  size_t *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_18._M_len = in_RSI;
  local_18._M_str = in_RDX;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (sVar2 < 2) {
    __assert_fail("flag.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x80e,"bool bloaty::ArgParser::TryParseOption(string_view, string_view *)");
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,1);
  local_29 = *pvVar3 == '-';
  local_40 = Arg((ArgParser *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  local_50 = local_18._M_len;
  local_48 = local_18._M_str;
  sVar4._M_len._4_1_ = in_stack_fffffffffffffec4;
  sVar4._M_len._0_4_ = in_stack_fffffffffffffec0;
  sVar4._M_len._5_1_ = in_stack_fffffffffffffec5;
  sVar4._M_len._6_1_ = in_stack_fffffffffffffec6;
  sVar4._M_len._7_1_ = in_stack_fffffffffffffec7;
  sVar4._M_str = (char *)in_stack_fffffffffffffec8;
  bVar1 = TryParseFlag(in_RDI,sVar4);
  if (bVar1) {
    bVar1 = IsDone(in_RDI);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      local_c8 = local_18._M_len;
      pcStack_c0 = local_18._M_str;
      value._M_str = local_18._M_str;
      value._M_len = local_18._M_len;
      absl::substitute_internal::Arg::Arg(local_b0,value);
      format._M_len._4_1_ = in_stack_fffffffffffffec4;
      format._M_len._0_4_ = in_stack_fffffffffffffec0;
      format._M_len._5_1_ = in_stack_fffffffffffffec5;
      format._M_len._6_1_ = in_stack_fffffffffffffec6;
      format._M_len._7_1_ = in_stack_fffffffffffffec7;
      format._M_str = (char *)in_stack_fffffffffffffec8;
      absl::Substitute_abi_cxx11_(format,(Arg *)in_RDI);
      std::__cxx11::string::c_str();
      Throw((char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),line);
    }
    sVar4 = ConsumeArg((ArgParser *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
    local_e8 = sVar4._M_len;
    *local_28 = local_e8;
    local_e0 = sVar4._M_str;
    local_28[1] = (size_t)local_e0;
    local_1 = true;
  }
  else {
    bVar8 = 0;
    bVar7 = 0;
    bVar6 = 0;
    bVar5 = false;
    if ((local_29 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffec7;
      std::allocator<char>::allocator();
      bVar8 = 1;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(1,CONCAT15(bVar7,CONCAT14(bVar6,in_stack_fffffffffffffec0)))));
      bVar7 = 1;
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffe97,
                                            CONCAT16(in_stack_fffffffffffffe96,
                                                     in_stack_fffffffffffffe90)));
      bVar6 = 1;
      local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_118);
      expected._M_str = (char *)in_RDI;
      expected._M_len = in_stack_fffffffffffffeb0;
      bVar5 = absl::ConsumePrefix(in_stack_fffffffffffffea8,expected);
    }
    if ((bVar6 & 1) != 0) {
      std::__cxx11::string::~string(local_118);
    }
    if ((bVar7 & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
    }
    if ((bVar8 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
    }
    if ((bVar5 & 1) == 0) {
      local_1 = false;
    }
    else {
      *local_28 = local_40._M_len;
      local_28[1] = (size_t)local_40._M_str;
      in_RDI->index_ = in_RDI->index_ + 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool TryParseOption(string_view flag, string_view* val) {
    assert(flag.size() > 1);
    bool is_long = flag[1] == '-';
    string_view arg = Arg();
    if (TryParseFlag(flag)) {
      if (IsDone()) {
        THROWF("option '$0' requires an argument", flag);
      }
      *val = ConsumeArg();
      return true;
    } else if (is_long && absl::ConsumePrefix(&arg, std::string(flag) + "=")) {
      *val = arg;
      index_++;
      return true;
    } else {
      return false;
    }
  }